

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O1

void big_array_iter_advance(BigArrayIter *iter)

{
  BigArray *pBVar1;
  bool bVar2;
  long lVar3;
  void *pvVar4;
  
  pBVar1 = iter->array;
  if (iter->contiguous != 0) {
    iter->dataptr = (void *)((long)iter->dataptr + pBVar1->strides[(long)pBVar1->ndim + -1]);
    return;
  }
  lVar3 = (long)pBVar1->ndim;
  iter->pos[lVar3 + -1] = iter->pos[lVar3 + -1] + 1;
  iter->dataptr = (void *)((long)iter->dataptr + pBVar1->strides[lVar3 + -1]);
  if (0 < lVar3) {
    do {
      if (iter->pos[lVar3 + -1] != pBVar1->dims[lVar3 + -1]) {
        return;
      }
      pvVar4 = (void *)((long)iter->dataptr - iter->pos[lVar3 + -1] * pBVar1->strides[lVar3 + -1]);
      iter->dataptr = pvVar4;
      iter->pos[lVar3 + -1] = 0;
      if (lVar3 != 1) {
        iter->pos[lVar3 + -2] = iter->pos[lVar3 + -2] + 1;
        iter->dataptr = (void *)((long)pvVar4 + pBVar1->strides[lVar3 + -2]);
      }
      bVar2 = 1 < lVar3;
      lVar3 = lVar3 + -1;
    } while (bVar2);
  }
  return;
}

Assistant:

void
big_array_iter_advance(BigArrayIter * iter)
{
    BigArray * array = iter->array;

    if(iter->contiguous) {
        iter->dataptr = (char*) iter->dataptr + array->strides[array->ndim - 1];
        return;
    }
    int k;
    iter->pos[array->ndim - 1] ++;
    iter->dataptr = ((char*) iter->dataptr) + array->strides[array->ndim - 1];
    for(k = array->ndim - 1; k >= 0; k --) {
        if(iter->pos[k] == array->dims[k]) {
            iter->dataptr = ((char*) iter->dataptr) - array->strides[k] * iter->pos[k];
            iter->pos[k] = 0;
            if(k > 0) {
                iter->pos[k - 1] ++;
                iter->dataptr = ((char*) iter->dataptr) + array->strides[k - 1];
            }
        } else {
            break;
        }
    }
}